

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disp_binder_helpers.hpp
# Opt level: O3

void __thiscall
so_5::disp::reuse::
binder_for_private_disp_template_t<so_5::intrusive_ptr_t<so_5::disp::active_obj::private_dispatcher_t>,_so_5::disp::active_obj::impl::proxy_dispatcher_t,_so_5::disp::active_obj::impl::binding_actions_t>
::unbind_agent(binder_for_private_disp_template_t<so_5::intrusive_ptr_t<so_5::disp::active_obj::private_dispatcher_t>,_so_5::disp::active_obj::impl::proxy_dispatcher_t,_so_5::disp::active_obj::impl::binding_actions_t>
               *this,environment_t *param_1,agent_ref_t *agent)

{
  atomic_refcounted_t *paVar1;
  proxy_dispatcher_t *ppVar2;
  agent_t *paVar3;
  
  ppVar2 = this->m_instance;
  paVar3 = agent->m_obj;
  agent->m_obj = (agent_t *)0x0;
  (*(ppVar2->super_proxy_dispatcher_base_t).super_actual_disp_iface_t.super_dispatcher_t.
    _vptr_dispatcher_t[7])(ppVar2,paVar3);
  if (paVar3 != (agent_t *)0x0) {
    LOCK();
    paVar1 = &paVar3->super_atomic_refcounted_t;
    (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i =
         (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i - 1;
    UNLOCK();
    if ((paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i == 0) {
      (*paVar3->_vptr_agent_t[1])(paVar3);
      return;
    }
  }
  return;
}

Assistant:

virtual void
		unbind_agent(
			environment_t & /* env */,
			agent_ref_t agent ) override
			{
				this->do_unbind( m_instance, std::move( agent ) );
			}